

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  BufferView<embree::Vec3fa> *pBVar8;
  char *pcVar9;
  float fVar10;
  uint index;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar41 [32];
  undefined1 auVar37 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  float fVar61;
  undefined4 uVar62;
  undefined1 auVar63 [16];
  float fVar64;
  vfloat4 a0_1;
  vfloat4 a0;
  undefined1 auVar65 [32];
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  float fVar81;
  float fVar82;
  float fVar83;
  vfloat4 b1;
  float fVar84;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  
  pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar3 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  uVar11 = (ulong)uVar3;
  pcVar5 = (pBVar4->super_RawBufferView).ptr_ofs;
  sVar6 = (pBVar4->super_RawBufferView).stride;
  lVar13 = sVar6 * uVar11;
  uVar16 = (ulong)(uVar3 + 1);
  lVar12 = sVar6 * uVar16;
  pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar7 = (pBVar4->super_RawBufferView).ptr_ofs;
  sVar6 = (pBVar4->super_RawBufferView).stride;
  lVar14 = sVar6 * uVar11;
  lVar15 = sVar6 * uVar16;
  fVar61 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           maxRadiusScale;
  pBVar8 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           normals.items;
  pcVar9 = (pBVar8->super_RawBufferView).ptr_ofs;
  sVar6 = (pBVar8->super_RawBufferView).stride;
  auVar37 = *(undefined1 (*) [16])(pcVar9 + sVar6 * uVar11);
  auVar35 = *(undefined1 (*) [16])(pcVar9 + sVar6 * uVar16);
  pBVar8 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           dnormals.items;
  pcVar9 = (pBVar8->super_RawBufferView).ptr_ofs;
  sVar6 = (pBVar8->super_RawBufferView).stride;
  aVar1 = (space->vx).field_0;
  aVar2 = (space->vy).field_0;
  auVar38 = *(undefined1 (*) [16])(space->vz).field_0.m128;
  auVar36 = vinsertps_avx(*(undefined1 (*) [16])(pcVar5 + lVar13),
                          ZEXT416((uint)(fVar61 * *(float *)(pcVar5 + lVar13 + 0xc))),0x30);
  auVar20 = vinsertps_avx(*(undefined1 (*) [16])(pcVar7 + lVar14),
                          ZEXT416((uint)(fVar61 * *(float *)(pcVar7 + lVar14 + 0xc))),0x30);
  auVar17 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
  auVar18 = vfnmadd213ps_avx512vl(auVar20,auVar17,auVar36);
  auVar20 = vinsertps_avx512f(*(undefined1 (*) [16])(pcVar7 + lVar15),
                              ZEXT416((uint)(fVar61 * *(float *)(pcVar7 + lVar15 + 0xc))),0x30);
  auVar34 = vinsertps_avx512f(*(undefined1 (*) [16])(pcVar5 + lVar12),
                              ZEXT416((uint)(fVar61 * *(float *)(pcVar5 + lVar12 + 0xc))),0x30);
  auVar19 = vfmadd213ps_avx512vl(auVar20,auVar17,auVar34);
  auVar86 = ZEXT816(0) << 0x40;
  auVar20 = vmulps_avx512vl(auVar34,auVar86);
  auVar21 = vfmadd231ps_avx512vl(auVar20,auVar19,auVar86);
  auVar20 = vfmadd213ps_fma(ZEXT816(0),auVar18,auVar21);
  auVar63._0_4_ = auVar36._0_4_ + auVar20._0_4_;
  auVar63._4_4_ = auVar36._4_4_ + auVar20._4_4_;
  auVar63._8_4_ = auVar36._8_4_ + auVar20._8_4_;
  auVar63._12_4_ = auVar36._12_4_ + auVar20._12_4_;
  auVar22 = vshufps_avx512vl(auVar63,auVar63,0xff);
  auVar23 = vfnmadd132ps_avx512vl(*(undefined1 (*) [16])(pcVar9 + uVar11 * sVar6),auVar37,auVar17);
  auVar24 = vfmadd132ps_avx512vl(auVar17,auVar35,*(undefined1 (*) [16])(pcVar9 + sVar6 * uVar16));
  auVar20 = vmulps_avx512vl(auVar35,auVar86);
  auVar25 = vfmadd231ps_avx512vl(auVar20,auVar24,auVar86);
  auVar20 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar23,auVar25);
  auVar28._0_4_ = auVar37._0_4_ + auVar20._0_4_;
  auVar28._4_4_ = auVar37._4_4_ + auVar20._4_4_;
  auVar28._8_4_ = auVar37._8_4_ + auVar20._8_4_;
  auVar28._12_4_ = auVar37._12_4_ + auVar20._12_4_;
  auVar26 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar20 = vfmadd231ps_avx512vl(auVar21,auVar18,auVar26);
  auVar27 = vfnmadd231ps_avx512vl(auVar20,auVar36,auVar26);
  auVar17 = vshufps_avx(auVar27,auVar27,0xc9);
  auVar20 = vshufps_avx(auVar28,auVar28,0xc9);
  fVar81 = auVar27._0_4_;
  auVar30._0_4_ = fVar81 * auVar20._0_4_;
  fVar82 = auVar27._4_4_;
  auVar30._4_4_ = fVar82 * auVar20._4_4_;
  fVar83 = auVar27._8_4_;
  auVar30._8_4_ = fVar83 * auVar20._8_4_;
  fVar84 = auVar27._12_4_;
  auVar30._12_4_ = fVar84 * auVar20._12_4_;
  auVar20 = vfmsub231ps_fma(auVar30,auVar17,auVar28);
  auVar21 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar20 = vdpps_avx(auVar21,auVar21,0x7f);
  fVar70 = auVar20._0_4_;
  auVar78._4_12_ = ZEXT812(0) << 0x20;
  auVar78._0_4_ = fVar70;
  auVar28 = vrsqrt14ss_avx512f(auVar86,auVar78);
  auVar29 = vmulss_avx512f(auVar28,ZEXT416(0x3fc00000));
  auVar30 = vmulss_avx512f(auVar20,ZEXT416(0x3f000000));
  auVar30 = vmulss_avx512f(auVar30,auVar28);
  auVar28 = vmulss_avx512f(auVar30,ZEXT416((uint)(auVar28._0_4_ * auVar28._0_4_)));
  auVar28 = vsubss_avx512f(auVar29,auVar28);
  auVar28 = vbroadcastss_avx512vl(auVar28);
  auVar29 = vmulps_avx512vl(auVar21,auVar28);
  auVar30 = vmulps_avx512vl(auVar22,auVar29);
  auVar31 = vaddps_avx512vl(auVar63,auVar30);
  auVar32 = vshufps_avx512vl(auVar31,auVar31,0x55);
  auVar33 = vshufps_avx512vl(auVar31,auVar31,0xaa);
  auVar33 = vmulps_avx512vl(auVar38,auVar33);
  auVar32 = vfmadd231ps_avx512vl(auVar33,(undefined1  [16])aVar2,auVar32);
  auVar33 = vbroadcastss_avx512vl(auVar31);
  auVar32 = vfmadd231ps_avx512vl(auVar32,(undefined1  [16])aVar1,auVar33);
  auVar33 = vshufps_avx512vl(auVar27,auVar27,0xff);
  auVar29 = vmulps_avx512vl(auVar33,auVar29);
  auVar25 = vfmadd231ps_avx512vl(auVar25,auVar23,auVar26);
  auVar33 = vfnmadd231ps_avx512vl(auVar25,auVar37,auVar26);
  auVar25 = vshufps_avx(auVar33,auVar33,0xc9);
  auVar85._0_4_ = fVar81 * auVar25._0_4_;
  auVar85._4_4_ = fVar82 * auVar25._4_4_;
  auVar85._8_4_ = fVar83 * auVar25._8_4_;
  auVar85._12_4_ = fVar84 * auVar25._12_4_;
  auVar17 = vfmsub231ps_fma(auVar85,auVar17,auVar33);
  auVar25 = vrcp14ss_avx512f(auVar86,auVar78);
  auVar20 = vfnmadd213ss_avx512f(auVar20,auVar25,ZEXT416(0x40000000));
  fVar61 = auVar20._0_4_ * auVar25._0_4_;
  auVar20 = vshufps_avx(auVar17,auVar17,0xc9);
  auVar79._0_4_ = fVar70 * auVar20._0_4_;
  auVar79._4_4_ = fVar70 * auVar20._4_4_;
  auVar79._8_4_ = fVar70 * auVar20._8_4_;
  auVar79._12_4_ = fVar70 * auVar20._12_4_;
  auVar20 = vdpps_avx(auVar21,auVar20,0x7f);
  fVar70 = auVar20._0_4_;
  auVar33._0_4_ = fVar70 * auVar21._0_4_;
  auVar33._4_4_ = fVar70 * auVar21._4_4_;
  auVar33._8_4_ = fVar70 * auVar21._8_4_;
  auVar33._12_4_ = fVar70 * auVar21._12_4_;
  auVar20 = vsubps_avx(auVar79,auVar33);
  auVar17._0_4_ = auVar20._0_4_ * fVar61;
  auVar17._4_4_ = auVar20._4_4_ * fVar61;
  auVar17._8_4_ = auVar20._8_4_ * fVar61;
  auVar17._12_4_ = auVar20._12_4_ * fVar61;
  auVar20 = vmulps_avx512vl(auVar28,auVar17);
  auVar20 = vmulps_avx512vl(auVar22,auVar20);
  auVar17 = vaddps_avx512vl(auVar29,auVar20);
  auVar29._8_4_ = 0x3eaaaaab;
  auVar29._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar29._12_4_ = 0x3eaaaaab;
  auVar20._0_4_ = (fVar81 + auVar17._0_4_) * 0.33333334;
  auVar20._4_4_ = (fVar82 + auVar17._4_4_) * 0.33333334;
  auVar20._8_4_ = (fVar83 + auVar17._8_4_) * 0.33333334;
  auVar20._12_4_ = (fVar84 + auVar17._12_4_) * 0.33333334;
  auVar20 = vaddps_avx512vl(auVar31,auVar20);
  auVar21 = vshufps_avx512vl(auVar20,auVar20,0xaa);
  auVar21 = vmulps_avx512vl(auVar38,auVar21);
  auVar25 = vshufps_avx512vl(auVar20,auVar20,0x55);
  auVar21 = vfmadd231ps_avx512vl(auVar21,(undefined1  [16])aVar2,auVar25);
  auVar22._0_4_ = auVar20._0_4_;
  auVar22._4_4_ = auVar22._0_4_;
  auVar22._8_4_ = auVar22._0_4_;
  auVar22._12_4_ = auVar22._0_4_;
  auVar21 = vfmadd231ps_avx512vl(auVar21,(undefined1  [16])aVar1,auVar22);
  auVar20 = vxorps_avx512vl(auVar25,auVar25);
  auVar20 = vfmadd213ps_avx512vl(auVar20,auVar19,auVar34);
  auVar25 = vmulps_avx512vl(auVar34,auVar26);
  auVar25 = vfnmadd231ps_avx512vl(auVar25,auVar26,auVar19);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar20 = vfmadd231ps_avx512vl(auVar20,auVar18,auVar86);
  auVar25 = vfmadd231ps_avx512vl(auVar25,auVar86,auVar18);
  auVar40 = vpermps_avx512vl(auVar39,ZEXT1632(auVar32));
  auVar34 = vfmadd231ps_avx512vl(auVar20,auVar36,auVar86);
  auVar25 = vfnmadd231ps_avx512vl(auVar25,auVar86,auVar36);
  auVar20 = vfmadd213ps_avx512vl(ZEXT416(0) << 0x20,auVar24,auVar35);
  auVar20 = vfmadd231ps_fma(auVar20,auVar23,auVar86);
  auVar20 = vfmadd231ps_fma(auVar20,auVar37,auVar86);
  auVar35 = vmulps_avx512vl(auVar35,auVar26);
  auVar36 = vfnmadd231ps_avx512vl(auVar35,auVar26,auVar24);
  auVar18 = vshufps_avx512vl(auVar25,auVar25,0xc9);
  auVar35 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar35 = vmulps_avx512vl(auVar25,auVar35);
  auVar35 = vfmsub231ps_avx512vl(auVar35,auVar18,auVar20);
  auVar20 = vshufps_avx(auVar35,auVar35,0xc9);
  auVar35 = vdpps_avx(auVar20,auVar20,0x7f);
  auVar36 = vfmadd231ps_fma(auVar36,auVar86,auVar23);
  auVar41 = vpermps_avx512vl(auVar39,ZEXT1632(auVar21));
  auVar36 = vfnmadd231ps_fma(auVar36,auVar86,auVar37);
  auVar37 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar37 = vmulps_avx512vl(auVar25,auVar37);
  auVar37 = vfmsub231ps_avx512vl(auVar37,auVar18,auVar36);
  fVar61 = auVar35._0_4_;
  auVar26._4_12_ = ZEXT812(0) << 0x20;
  auVar26._0_4_ = fVar61;
  auVar36 = vrsqrt14ss_avx512f(auVar86,auVar26);
  auVar18 = vmulss_avx512f(auVar36,ZEXT416(0x3fc00000));
  auVar19 = vmulss_avx512f(auVar35,ZEXT416(0x3f000000));
  auVar19 = vmulss_avx512f(auVar19,auVar36);
  auVar36 = vmulss_avx512f(auVar19,ZEXT416((uint)(auVar36._0_4_ * auVar36._0_4_)));
  auVar19 = vshufps_avx512vl(auVar34,auVar34,0xff);
  auVar36 = vsubss_avx512f(auVar18,auVar36);
  auVar36 = vbroadcastss_avx512vl(auVar36);
  auVar37 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar24._0_4_ = fVar61 * auVar37._0_4_;
  auVar24._4_4_ = fVar61 * auVar37._4_4_;
  auVar24._8_4_ = fVar61 * auVar37._8_4_;
  auVar24._12_4_ = fVar61 * auVar37._12_4_;
  auVar37 = vdpps_avx(auVar20,auVar37,0x7f);
  fVar61 = auVar37._0_4_;
  auVar37._0_4_ = fVar61 * auVar20._0_4_;
  auVar37._4_4_ = fVar61 * auVar20._4_4_;
  auVar37._8_4_ = fVar61 * auVar20._8_4_;
  auVar37._12_4_ = fVar61 * auVar20._12_4_;
  auVar20 = vmulps_avx512vl(auVar20,auVar36);
  auVar37 = vsubps_avx(auVar24,auVar37);
  auVar18 = vshufps_avx512vl(auVar25,auVar25,0xff);
  auVar18 = vmulps_avx512vl(auVar18,auVar20);
  auVar20 = vmulps_avx512vl(auVar19,auVar20);
  auVar22 = vrcp14ss_avx512f(auVar86,auVar26);
  auVar23 = vaddps_avx512vl(auVar34,auVar20);
  auVar35 = vfnmadd213ss_avx512f(auVar35,auVar22,ZEXT416(0x40000000));
  fVar61 = auVar22._0_4_ * auVar35._0_4_;
  auVar35._0_4_ = auVar37._0_4_ * fVar61;
  auVar35._4_4_ = auVar37._4_4_ * fVar61;
  auVar35._8_4_ = auVar37._8_4_ * fVar61;
  auVar35._12_4_ = auVar37._12_4_ * fVar61;
  auVar37 = vmulps_avx512vl(auVar36,auVar35);
  auVar37 = vmulps_avx512vl(auVar19,auVar37);
  auVar36 = vaddps_avx512vl(auVar18,auVar37);
  auVar37 = vaddps_avx512vl(auVar25,auVar36);
  auVar37 = vmulps_avx512vl(auVar37,auVar29);
  auVar35 = vsubps_avx(auVar23,auVar37);
  uVar62 = auVar35._0_4_;
  auVar19._4_4_ = uVar62;
  auVar19._0_4_ = uVar62;
  auVar19._8_4_ = uVar62;
  auVar19._12_4_ = uVar62;
  auVar37 = vshufps_avx(auVar35,auVar35,0x55);
  auVar35 = vshufps_avx(auVar35,auVar35,0xaa);
  fVar66 = auVar38._0_4_;
  auVar18._0_4_ = fVar66 * auVar35._0_4_;
  fVar67 = auVar38._4_4_;
  auVar18._4_4_ = fVar67 * auVar35._4_4_;
  fVar68 = auVar38._8_4_;
  auVar18._8_4_ = fVar68 * auVar35._8_4_;
  fVar69 = auVar38._12_4_;
  auVar18._12_4_ = fVar69 * auVar35._12_4_;
  auVar37 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar2,auVar37);
  auVar35 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar1,auVar19);
  auVar42 = vpermps_avx512vl(auVar39,ZEXT1632(auVar35));
  auVar18 = vbroadcastss_avx512vl(auVar23);
  auVar19 = vshufps_avx512vl(auVar23,auVar23,0x55);
  auVar37 = vshufps_avx(auVar23,auVar23,0xaa);
  auVar23._0_4_ = fVar66 * auVar37._0_4_;
  auVar23._4_4_ = fVar67 * auVar37._4_4_;
  auVar23._8_4_ = fVar68 * auVar37._8_4_;
  auVar23._12_4_ = fVar69 * auVar37._12_4_;
  auVar37 = vfmadd231ps_avx512vl(auVar23,(undefined1  [16])aVar2,auVar19);
  auVar18 = vfmadd231ps_avx512vl(auVar37,(undefined1  [16])aVar1,auVar18);
  auVar43 = vpermps_avx512vl(auVar39,ZEXT1632(auVar18));
  auVar39 = vmulps_avx512vl(auVar43,bezier_basis0._3944_32_);
  auVar39 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._2788_32_,auVar42);
  auVar39 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._1632_32_,auVar41);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar45 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._476_32_,auVar40);
  auVar46 = vmaxps_avx512vl(auVar44,auVar45);
  fVar61 = bezier_basis0._8568_4_;
  fVar70 = bezier_basis0._8572_4_;
  auVar39._4_4_ = auVar43._4_4_ * fVar70;
  auVar39._0_4_ = auVar43._0_4_ * fVar61;
  fVar81 = bezier_basis0._8576_4_;
  auVar39._8_4_ = auVar43._8_4_ * fVar81;
  fVar82 = bezier_basis0._8580_4_;
  auVar39._12_4_ = auVar43._12_4_ * fVar82;
  fVar83 = bezier_basis0._8584_4_;
  auVar39._16_4_ = auVar43._16_4_ * fVar83;
  fVar84 = bezier_basis0._8588_4_;
  auVar39._20_4_ = auVar43._20_4_ * fVar84;
  fVar10 = bezier_basis0._8592_4_;
  auVar39._24_4_ = auVar43._24_4_ * fVar10;
  auVar39._28_4_ = auVar43._28_4_;
  auVar37 = vfmadd231ps_fma(auVar39,bezier_basis0._7412_32_,auVar42);
  auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),bezier_basis0._6256_32_,auVar41);
  auVar39 = vfmadd231ps_avx512vl(ZEXT1632(auVar37),bezier_basis0._5100_32_,auVar40);
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
  auVar40 = vmulps_avx512vl(auVar39,auVar47);
  auVar39 = vblendps_avx(auVar40,ZEXT832(0) << 0x20,1);
  auVar48 = vsubps_avx512vl(auVar45,auVar39);
  auVar39 = vblendps_avx(auVar40,ZEXT832(0) << 0x20,0x80);
  auVar49 = vaddps_avx512vl(auVar45,auVar39);
  auVar39 = vmaxps_avx512vl(auVar48,auVar49);
  auVar50 = vmaxps_avx512vl(auVar46,auVar39);
  auVar51 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar39 = vpermps_avx512vl(auVar51,ZEXT1632(auVar35));
  auVar41 = vpermps_avx512vl(auVar51,ZEXT1632(auVar18));
  auVar40 = vmulps_avx512vl(auVar41,bezier_basis0._3944_32_);
  auVar42 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._2788_32_,auVar39);
  auVar40._4_4_ = auVar41._4_4_ * fVar70;
  auVar40._0_4_ = auVar41._0_4_ * fVar61;
  auVar40._8_4_ = auVar41._8_4_ * fVar81;
  auVar40._12_4_ = auVar41._12_4_ * fVar82;
  auVar40._16_4_ = auVar41._16_4_ * fVar83;
  auVar40._20_4_ = auVar41._20_4_ * fVar84;
  auVar40._24_4_ = auVar41._24_4_ * fVar10;
  auVar40._28_4_ = auVar41._28_4_;
  auVar37 = vfmadd231ps_fma(auVar40,bezier_basis0._7412_32_,auVar39);
  auVar39 = vpermps_avx512vl(auVar51,ZEXT1632(auVar21));
  auVar40 = vfmadd231ps_avx512vl(auVar42,bezier_basis0._1632_32_,auVar39);
  auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),bezier_basis0._6256_32_,auVar39);
  auVar39 = vpermps_avx512vl(auVar51,ZEXT1632(auVar32));
  auVar46 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._476_32_,auVar39);
  auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),bezier_basis0._5100_32_,auVar39);
  auVar40 = vmulps_avx512vl(ZEXT1632(auVar37),auVar47);
  auVar80 = ZEXT832(0) << 0x20;
  auVar39 = vblendps_avx(auVar40,auVar80,1);
  auVar52 = vsubps_avx512vl(auVar46,auVar39);
  auVar39 = vblendps_avx(auVar40,auVar80,0x80);
  auVar53 = vaddps_avx512vl(auVar46,auVar39);
  auVar39 = vmaxps_avx512vl(auVar44,auVar46);
  auVar40 = vmaxps_avx512vl(auVar52,auVar53);
  auVar54 = vmaxps_avx512vl(auVar39,auVar40);
  auVar39 = vbroadcastss_avx512vl(auVar35);
  fVar64 = auVar18._0_4_;
  fVar71 = bezier_basis0._3944_4_;
  auVar55._0_4_ = fVar71 * fVar64;
  fVar72 = bezier_basis0._3948_4_;
  auVar55._4_4_ = fVar72 * fVar64;
  fVar73 = bezier_basis0._3952_4_;
  auVar55._8_4_ = fVar73 * fVar64;
  fVar74 = bezier_basis0._3956_4_;
  auVar55._12_4_ = fVar74 * fVar64;
  fVar75 = bezier_basis0._3960_4_;
  auVar55._16_4_ = fVar75 * fVar64;
  fVar76 = bezier_basis0._3964_4_;
  auVar55._20_4_ = fVar76 * fVar64;
  fVar77 = bezier_basis0._3968_4_;
  auVar55._24_4_ = fVar77 * fVar64;
  auVar55._28_4_ = 0;
  auVar40 = vfmadd231ps_avx512vl(auVar55,bezier_basis0._2788_32_,auVar39);
  auVar41._4_4_ = fVar70 * fVar64;
  auVar41._0_4_ = fVar61 * fVar64;
  auVar41._8_4_ = fVar81 * fVar64;
  auVar41._12_4_ = fVar82 * fVar64;
  auVar41._16_4_ = fVar83 * fVar64;
  auVar41._20_4_ = fVar84 * fVar64;
  auVar41._24_4_ = fVar10 * fVar64;
  auVar41._28_4_ = fVar64;
  auVar39 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._7412_32_,auVar39);
  auVar41 = vbroadcastss_avx512vl(auVar21);
  auVar40 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._1632_32_,auVar41);
  auVar39 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._6256_32_,auVar41);
  auVar41 = vbroadcastss_avx512vl(auVar32);
  auVar55 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._476_32_,auVar41);
  auVar39 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._5100_32_,auVar41);
  auVar35 = vsubps_avx512vl(auVar63,auVar30);
  auVar37 = vshufps_avx512vl(auVar35,auVar35,0xaa);
  auVar37 = vmulps_avx512vl(auVar38,auVar37);
  auVar21 = vshufps_avx512vl(auVar35,auVar35,0x55);
  auVar37 = vfmadd231ps_avx512vl(auVar37,(undefined1  [16])aVar2,auVar21);
  auVar21 = vbroadcastss_avx512vl(auVar35);
  auVar21 = vfmadd231ps_avx512vl(auVar37,(undefined1  [16])aVar1,auVar21);
  auVar37 = vsubps_avx(auVar27,auVar17);
  auVar27._0_4_ = auVar37._0_4_ * 0.33333334;
  auVar27._4_4_ = auVar37._4_4_ * 0.33333334;
  auVar27._8_4_ = auVar37._8_4_ * 0.33333334;
  auVar27._12_4_ = auVar37._12_4_ * 0.33333334;
  auVar37 = vaddps_avx512vl(auVar35,auVar27);
  auVar35 = vshufps_avx512vl(auVar37,auVar37,0xaa);
  auVar31._0_4_ = auVar35._0_4_ * fVar66;
  auVar31._4_4_ = auVar35._4_4_ * fVar67;
  auVar31._8_4_ = auVar35._8_4_ * fVar68;
  auVar31._12_4_ = auVar35._12_4_ * fVar69;
  auVar35 = vshufps_avx512vl(auVar37,auVar37,0x55);
  auVar35 = vfmadd231ps_avx512vl(auVar31,(undefined1  [16])aVar2,auVar35);
  auVar37 = vbroadcastss_avx512vl(auVar37);
  auVar17 = vfmadd231ps_avx512vl(auVar35,(undefined1  [16])aVar1,auVar37);
  auVar35 = vsubps_avx512vl(auVar34,auVar20);
  auVar37 = vsubps_avx512vl(auVar25,auVar36);
  auVar36._0_4_ = auVar37._0_4_ * 0.33333334;
  auVar36._4_4_ = auVar37._4_4_ * 0.33333334;
  auVar36._8_4_ = auVar37._8_4_ * 0.33333334;
  auVar36._12_4_ = auVar37._12_4_ * 0.33333334;
  auVar37 = vsubps_avx512vl(auVar35,auVar36);
  auVar20 = vbroadcastss_avx512vl(auVar37);
  auVar36 = vshufps_avx512vl(auVar37,auVar37,0x55);
  auVar37 = vshufps_avx(auVar37,auVar37,0xaa);
  auVar34._0_4_ = fVar66 * auVar37._0_4_;
  auVar34._4_4_ = fVar67 * auVar37._4_4_;
  auVar34._8_4_ = fVar68 * auVar37._8_4_;
  auVar34._12_4_ = fVar69 * auVar37._12_4_;
  auVar37 = vfmadd231ps_avx512vl(auVar34,(undefined1  [16])aVar2,auVar36);
  auVar37 = vfmadd231ps_avx512vl(auVar37,(undefined1  [16])aVar1,auVar20);
  auVar87._8_4_ = 2;
  auVar87._0_8_ = 0x200000002;
  auVar87._12_4_ = 2;
  auVar87._16_4_ = 2;
  auVar87._20_4_ = 2;
  auVar87._24_4_ = 2;
  auVar87._28_4_ = 2;
  auVar40 = vpermps_avx512vl(auVar87,ZEXT1632(auVar37));
  auVar20 = vshufps_avx512vl(auVar35,auVar35,0xaa);
  auVar38 = vmulps_avx512vl(auVar38,auVar20);
  auVar20 = vbroadcastss_avx512vl(auVar35);
  auVar35 = vshufps_avx512vl(auVar35,auVar35,0x55);
  auVar35 = vfmadd231ps_avx512vl(auVar38,(undefined1  [16])aVar2,auVar35);
  auVar35 = vfmadd231ps_avx512vl(auVar35,(undefined1  [16])aVar1,auVar20);
  auVar41 = vpermps_avx512vl(auVar87,ZEXT1632(auVar35));
  auVar57._0_4_ = fVar71 * auVar41._0_4_;
  auVar57._4_4_ = fVar72 * auVar41._4_4_;
  auVar57._8_4_ = fVar73 * auVar41._8_4_;
  auVar57._12_4_ = fVar74 * auVar41._12_4_;
  auVar57._16_4_ = fVar75 * auVar41._16_4_;
  auVar57._20_4_ = fVar76 * auVar41._20_4_;
  auVar57._24_4_ = fVar77 * auVar41._24_4_;
  auVar57._28_4_ = 0;
  auVar56 = vfmadd231ps_avx512vl(auVar57,bezier_basis0._2788_32_,auVar40);
  auVar58._0_4_ = fVar61 * auVar41._0_4_;
  auVar58._4_4_ = fVar70 * auVar41._4_4_;
  auVar58._8_4_ = fVar81 * auVar41._8_4_;
  auVar58._12_4_ = fVar82 * auVar41._12_4_;
  auVar58._16_4_ = fVar83 * auVar41._16_4_;
  auVar58._20_4_ = fVar84 * auVar41._20_4_;
  auVar58._24_4_ = fVar10 * auVar41._24_4_;
  auVar58._28_4_ = 0;
  auVar41 = vfmadd231ps_avx512vl(auVar58,bezier_basis0._7412_32_,auVar40);
  auVar40 = vpermps_avx512vl(auVar51,ZEXT1632(auVar37));
  auVar42 = vpermps_avx512vl(auVar51,ZEXT1632(auVar35));
  auVar43 = vmulps_avx512vl(auVar42,bezier_basis0._3944_32_);
  auVar57 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._2788_32_,auVar40);
  auVar42 = vmulps_avx512vl(auVar42,bezier_basis0._8568_32_);
  auVar58 = vfmadd231ps_avx512vl(auVar42,bezier_basis0._7412_32_,auVar40);
  auVar65._0_4_ = auVar37._0_4_;
  auVar65._4_4_ = auVar65._0_4_;
  auVar65._8_4_ = auVar65._0_4_;
  auVar65._12_4_ = auVar65._0_4_;
  auVar65._16_4_ = auVar65._0_4_;
  auVar65._20_4_ = auVar65._0_4_;
  auVar65._24_4_ = auVar65._0_4_;
  auVar65._28_4_ = auVar65._0_4_;
  auVar40 = vbroadcastss_avx512vl(auVar35);
  auVar42._4_4_ = fVar72 * auVar40._4_4_;
  auVar42._0_4_ = fVar71 * auVar40._0_4_;
  auVar42._8_4_ = fVar73 * auVar40._8_4_;
  auVar42._12_4_ = fVar74 * auVar40._12_4_;
  auVar42._16_4_ = fVar75 * auVar40._16_4_;
  auVar42._20_4_ = fVar76 * auVar40._20_4_;
  auVar42._24_4_ = fVar77 * auVar40._24_4_;
  auVar42._28_4_ = bezier_basis0._3972_4_;
  auVar59 = vfmadd231ps_avx512vl(auVar42,auVar65,bezier_basis0._2788_32_);
  auVar43._4_4_ = fVar70 * auVar40._4_4_;
  auVar43._0_4_ = fVar61 * auVar40._0_4_;
  auVar43._8_4_ = fVar81 * auVar40._8_4_;
  auVar43._12_4_ = fVar82 * auVar40._12_4_;
  auVar43._16_4_ = fVar83 * auVar40._16_4_;
  auVar43._20_4_ = fVar84 * auVar40._20_4_;
  auVar43._24_4_ = fVar10 * auVar40._24_4_;
  auVar43._28_4_ = bezier_basis0._8596_4_;
  auVar42 = vmaxps_avx512vl(auVar44,auVar55);
  auVar60 = vmulps_avx512vl(auVar39,auVar47);
  auVar37 = vfmadd231ps_fma(auVar43,bezier_basis0._7412_32_,auVar65);
  auVar39 = vblendps_avx(auVar60,auVar80,1);
  auVar40 = vsubps_avx(auVar55,auVar39);
  auVar39 = vblendps_avx(auVar60,auVar80,0x80);
  auVar39 = vaddps_avx512vl(auVar55,auVar39);
  auVar43 = vmaxps_avx512vl(auVar40,auVar39);
  auVar60 = vmaxps_avx512vl(auVar42,auVar43);
  auVar42 = vminps_avx512vl(auVar48,auVar49);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar43 = vminps_avx512vl(auVar49,auVar45);
  auVar42 = vminps_avx(auVar43,auVar42);
  auVar43 = vminps_avx512vl(auVar52,auVar53);
  auVar45 = vminps_avx512vl(auVar49,auVar46);
  auVar43 = vminps_avx(auVar45,auVar43);
  auVar39 = vminps_avx512vl(auVar40,auVar39);
  auVar40 = vminps_avx512vl(auVar49,auVar55);
  auVar45 = vminps_avx(auVar40,auVar39);
  auVar39 = vpermps_avx2(auVar87,ZEXT1632(auVar17));
  auVar40 = vfmadd231ps_avx512vl(auVar56,bezier_basis0._1632_32_,auVar39);
  auVar35 = vfmadd231ps_fma(auVar41,bezier_basis0._6256_32_,auVar39);
  auVar39 = vpermps_avx512vl(auVar87,ZEXT1632(auVar21));
  auVar52 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._476_32_,auVar39);
  auVar35 = vfmadd231ps_fma(ZEXT1632(auVar35),bezier_basis0._5100_32_,auVar39);
  auVar39 = vpermps_avx512vl(auVar51,ZEXT1632(auVar17));
  auVar41 = vfmadd231ps_avx512vl(auVar57,bezier_basis0._1632_32_,auVar39);
  auVar48 = vfmadd231ps_avx512vl(auVar58,bezier_basis0._6256_32_,auVar39);
  uVar62 = auVar17._0_4_;
  auVar46._4_4_ = uVar62;
  auVar46._0_4_ = uVar62;
  auVar46._8_4_ = uVar62;
  auVar46._12_4_ = uVar62;
  auVar46._16_4_ = uVar62;
  auVar46._20_4_ = uVar62;
  auVar46._24_4_ = uVar62;
  auVar46._28_4_ = uVar62;
  auVar53 = vfmadd231ps_avx512vl(auVar59,auVar46,bezier_basis0._1632_32_);
  auVar40 = vmaxps_avx512vl(auVar44,auVar52);
  auVar55 = vmulps_avx512vl(ZEXT1632(auVar35),auVar47);
  auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),bezier_basis0._6256_32_,auVar46);
  auVar57 = ZEXT832(0) << 0x20;
  auVar39 = vblendps_avx(auVar55,auVar57,1);
  auVar46 = vsubps_avx(auVar52,auVar39);
  auVar39 = vblendps_avx(auVar55,auVar57,0x80);
  auVar59._0_4_ = auVar52._0_4_ + auVar39._0_4_;
  auVar59._4_4_ = auVar52._4_4_ + auVar39._4_4_;
  auVar59._8_4_ = auVar52._8_4_ + auVar39._8_4_;
  auVar59._12_4_ = auVar52._12_4_ + auVar39._12_4_;
  auVar59._16_4_ = auVar52._16_4_ + auVar39._16_4_;
  auVar59._20_4_ = auVar52._20_4_ + auVar39._20_4_;
  auVar59._24_4_ = auVar52._24_4_ + auVar39._24_4_;
  auVar59._28_4_ = auVar52._28_4_ + auVar39._28_4_;
  auVar39 = vmaxps_avx(auVar46,auVar59);
  auVar40 = vmaxps_avx(auVar40,auVar39);
  auVar39 = vpermps_avx512vl(auVar51,ZEXT1632(auVar21));
  auVar51 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._476_32_,auVar39);
  auVar39 = vfmadd231ps_avx512vl(auVar48,bezier_basis0._5100_32_,auVar39);
  auVar41 = vbroadcastss_avx512vl(auVar21);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar41,bezier_basis0._476_32_);
  auVar55 = vmaxps_avx512vl(auVar44,auVar51);
  auVar56 = vmulps_avx512vl(auVar39,auVar47);
  auVar37 = vfmadd231ps_fma(ZEXT1632(auVar37),bezier_basis0._5100_32_,auVar41);
  auVar39 = vblendps_avx(auVar56,auVar57,1);
  auVar48 = vsubps_avx(auVar51,auVar39);
  auVar39 = vblendps_avx(auVar56,auVar57,0x80);
  auVar56._0_4_ = auVar51._0_4_ + auVar39._0_4_;
  auVar56._4_4_ = auVar51._4_4_ + auVar39._4_4_;
  auVar56._8_4_ = auVar51._8_4_ + auVar39._8_4_;
  auVar56._12_4_ = auVar51._12_4_ + auVar39._12_4_;
  auVar56._16_4_ = auVar51._16_4_ + auVar39._16_4_;
  auVar56._20_4_ = auVar51._20_4_ + auVar39._20_4_;
  auVar56._24_4_ = auVar51._24_4_ + auVar39._24_4_;
  auVar56._28_4_ = auVar51._28_4_ + auVar39._28_4_;
  auVar39 = vmaxps_avx(auVar48,auVar56);
  auVar41 = vmaxps_avx(auVar55,auVar39);
  auVar55 = vmaxps_avx512vl(auVar44,auVar53);
  auVar47 = vmulps_avx512vl(ZEXT1632(auVar37),auVar47);
  auVar39 = vblendps_avx(auVar47,auVar57,1);
  auVar44 = vsubps_avx(auVar53,auVar39);
  auVar39 = vblendps_avx(auVar47,auVar57,0x80);
  auVar80._0_4_ = auVar53._0_4_ + auVar39._0_4_;
  auVar80._4_4_ = auVar53._4_4_ + auVar39._4_4_;
  auVar80._8_4_ = auVar53._8_4_ + auVar39._8_4_;
  auVar80._12_4_ = auVar53._12_4_ + auVar39._12_4_;
  auVar80._16_4_ = auVar53._16_4_ + auVar39._16_4_;
  auVar80._20_4_ = auVar53._20_4_ + auVar39._20_4_;
  auVar80._24_4_ = auVar53._24_4_ + auVar39._24_4_;
  auVar80._28_4_ = auVar53._28_4_ + auVar39._28_4_;
  auVar39 = vmaxps_avx(auVar44,auVar80);
  auVar39 = vmaxps_avx(auVar55,auVar39);
  auVar46 = vminps_avx(auVar46,auVar59);
  auVar47 = vminps_avx512vl(auVar49,auVar52);
  auVar46 = vminps_avx(auVar47,auVar46);
  auVar48 = vminps_avx(auVar48,auVar56);
  auVar47 = vminps_avx512vl(auVar49,auVar51);
  auVar48 = vminps_avx(auVar47,auVar48);
  auVar47 = vminps_avx512vl(auVar49,auVar53);
  auVar44 = vminps_avx(auVar44,auVar80);
  auVar44 = vminps_avx(auVar47,auVar44);
  auVar47 = vshufps_avx(auVar39,auVar39,0xb1);
  auVar39 = vmaxps_avx(auVar39,auVar47);
  auVar47 = vshufpd_avx(auVar39,auVar39,5);
  auVar39 = vmaxps_avx(auVar39,auVar47);
  auVar37 = vmaxps_avx(auVar39._0_16_,auVar39._16_16_);
  auVar39 = vshufps_avx(auVar41,auVar41,0xb1);
  auVar39 = vmaxps_avx(auVar41,auVar39);
  auVar41 = vshufpd_avx(auVar39,auVar39,5);
  auVar39 = vmaxps_avx(auVar39,auVar41);
  auVar35 = vmaxps_avx(auVar39._0_16_,auVar39._16_16_);
  auVar35 = vunpcklps_avx(auVar37,auVar35);
  auVar39 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar39 = vmaxps_avx(auVar40,auVar39);
  auVar40 = vshufpd_avx(auVar39,auVar39,5);
  auVar39 = vmaxps_avx(auVar39,auVar40);
  auVar37 = vmaxps_avx(auVar39._0_16_,auVar39._16_16_);
  auVar37 = vinsertps_avx(auVar35,auVar37,0x28);
  auVar39 = vshufps_avx(auVar44,auVar44,0xb1);
  auVar39 = vminps_avx(auVar44,auVar39);
  auVar40 = vshufpd_avx(auVar39,auVar39,5);
  auVar39 = vminps_avx(auVar39,auVar40);
  auVar35 = vminps_avx(auVar39._0_16_,auVar39._16_16_);
  auVar39 = vshufps_avx(auVar48,auVar48,0xb1);
  auVar39 = vminps_avx(auVar48,auVar39);
  auVar40 = vshufpd_avx(auVar39,auVar39,5);
  auVar39 = vminps_avx(auVar39,auVar40);
  auVar38 = vminps_avx(auVar39._0_16_,auVar39._16_16_);
  auVar38 = vunpcklps_avx(auVar35,auVar38);
  auVar39 = vshufps_avx(auVar46,auVar46,0xb1);
  auVar39 = vminps_avx(auVar46,auVar39);
  auVar40 = vshufpd_avx(auVar39,auVar39,5);
  auVar39 = vminps_avx(auVar39,auVar40);
  auVar35 = vminps_avx(auVar39._0_16_,auVar39._16_16_);
  auVar35 = vinsertps_avx(auVar38,auVar35,0x28);
  auVar39 = vshufps_avx(auVar45,auVar45,0xb1);
  auVar39 = vminps_avx(auVar45,auVar39);
  auVar40 = vshufpd_avx(auVar39,auVar39,5);
  auVar39 = vminps_avx(auVar39,auVar40);
  auVar38 = vminps_avx(auVar39._0_16_,auVar39._16_16_);
  auVar39 = vshufps_avx(auVar43,auVar43,0xb1);
  auVar39 = vminps_avx(auVar43,auVar39);
  auVar40 = vshufpd_avx(auVar39,auVar39,5);
  auVar39 = vminps_avx(auVar39,auVar40);
  auVar20 = vminps_avx(auVar39._0_16_,auVar39._16_16_);
  auVar20 = vunpcklps_avx(auVar38,auVar20);
  auVar39 = vshufps_avx(auVar42,auVar42,0xb1);
  auVar39 = vminps_avx(auVar42,auVar39);
  auVar40 = vshufpd_avx(auVar39,auVar39,5);
  auVar39 = vminps_avx(auVar39,auVar40);
  auVar38 = vminps_avx(auVar39._0_16_,auVar39._16_16_);
  auVar38 = vinsertps_avx(auVar20,auVar38,0x28);
  auVar20 = vminps_avx(auVar35,auVar38);
  auVar39 = vshufps_avx512vl(auVar60,auVar60,0xb1);
  auVar40 = vmaxps_avx512vl(auVar60,auVar39);
  auVar39 = vshufpd_avx(auVar40,auVar40,5);
  auVar39 = vmaxps_avx(auVar40,auVar39);
  auVar35 = vmaxps_avx(auVar39._0_16_,auVar39._16_16_);
  auVar39 = vshufps_avx(auVar54,auVar54,0xb1);
  auVar39 = vmaxps_avx(auVar54,auVar39);
  auVar40 = vshufpd_avx(auVar39,auVar39,5);
  auVar39 = vmaxps_avx(auVar39,auVar40);
  auVar38 = vmaxps_avx(auVar39._0_16_,auVar39._16_16_);
  auVar38 = vunpcklps_avx(auVar35,auVar38);
  auVar39 = vshufps_avx(auVar50,auVar50,0xb1);
  auVar39 = vmaxps_avx(auVar50,auVar39);
  auVar40 = vshufpd_avx(auVar39,auVar39,5);
  auVar39 = vmaxps_avx(auVar39,auVar40);
  auVar35 = vmaxps_avx(auVar39._0_16_,auVar39._16_16_);
  auVar35 = vinsertps_avx(auVar38,auVar35,0x28);
  auVar38 = vmaxps_avx(auVar37,auVar35);
  auVar21._8_4_ = 0x7fffffff;
  auVar21._0_8_ = 0x7fffffff7fffffff;
  auVar21._12_4_ = 0x7fffffff;
  auVar37 = vandps_avx(auVar20,auVar21);
  auVar35 = vandps_avx(auVar38,auVar21);
  auVar37 = vmaxps_avx(auVar37,auVar35);
  auVar35 = vmovshdup_avx(auVar37);
  auVar35 = vmaxss_avx(auVar35,auVar37);
  auVar37 = vshufpd_avx(auVar37,auVar37,1);
  auVar37 = vmaxss_avx(auVar37,auVar35);
  fVar61 = auVar37._0_4_ * 4.7683716e-07;
  auVar25._4_4_ = fVar61;
  auVar25._0_4_ = fVar61;
  auVar25._8_4_ = fVar61;
  auVar25._12_4_ = fVar61;
  aVar1 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar20,auVar25);
  (__return_storage_ptr__->lower).field_0 = aVar1;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar38._0_4_ + fVar61;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar38._4_4_ + fVar61;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar38._8_4_ + fVar61;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar38._12_4_ + fVar61;
  return __return_storage_ptr__;
}

Assistant:

size_t CurveGeometry::getGeometryDataDeviceByteSize() const {
    size_t byte_size = sizeof(CurveGeometry);
    if (vertices.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (normals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    if (tangents.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (dnormals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    return 16 * ((byte_size + 15) / 16);
  }